

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O3

void GraphTask::setup(search *sch,multi_ex *ec)

{
  pointer *ppuVar1;
  uint uVar2;
  task_data *D;
  example *peVar3;
  wclass *pwVar4;
  pointer pvVar5;
  iterator iVar6;
  pointer puVar7;
  uint32_t uVar8;
  vw *pvVar9;
  ulong uVar10;
  ostream *poVar11;
  vw_exception *pvVar12;
  pointer ppeVar13;
  uint64_t *puVar14;
  uint32_t *puVar15;
  ulong uVar16;
  pointer ppeVar17;
  wclass *pwVar18;
  long lVar19;
  long lVar20;
  stringstream __msg;
  allocator_type local_259;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_258;
  value_type local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [392];
  
  D = (task_data *)sch->task_data;
  D->multiplier = D->wpp << ((byte)D->ss & 0x3f);
  pvVar9 = Search::search::get_vw_pointer_unsafe(sch);
  D->wpp = (ulong)pvVar9->wpp;
  pvVar9 = Search::search::get_vw_pointer_unsafe(sch);
  puVar14 = &(pvVar9->weights).dense_weights._weight_mask;
  if ((pvVar9->weights).sparse != false) {
    puVar14 = &(pvVar9->weights).sparse_weights._weight_mask;
  }
  D->mask = *puVar14;
  pvVar9 = Search::search::get_vw_pointer_unsafe(sch);
  puVar15 = &(pvVar9->weights).dense_weights._stride_shift;
  if ((pvVar9->weights).sparse != false) {
    puVar15 = &(pvVar9->weights).sparse_weights._stride_shift;
  }
  D->ss = (ulong)*puVar15;
  D->N = 0;
  D->E = 0;
  ppeVar13 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if ((ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar13) {
    uVar10 = 0;
    do {
      if ((ulong)((long)(ppeVar13[uVar10]->l).cs.costs._end -
                 (long)(ppeVar13[uVar10]->l).cs.costs._begin) < 0x11) {
        if (D->E != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),"error: got a node after getting edges!",0x26);
          pvVar12 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar12,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search_graph.cc"
                     ,0xcb,&local_1d8);
          __cxa_throw(pvVar12,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        D->N = D->N + 1;
        peVar3 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar10];
        pwVar18 = (peVar3->l).cs.costs._begin;
        if ((peVar3->l).cs.costs._end != pwVar18) {
          uVar2 = pwVar18->class_index;
          D->true_counts[uVar2] = D->true_counts[uVar2] + 1.0;
          D->true_counts_total = D->true_counts_total + 1.0;
        }
      }
      else {
        D->E = D->E + 1;
      }
      uVar10 = uVar10 + 1;
      ppeVar13 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar13 >> 3)
            );
    uVar8 = D->N;
    if (uVar8 != 0) goto LAB_00281b86;
    if (D->E != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),
                 "error: got edges without any nodes (perhaps ring_size is too small?)!",0x45);
      pvVar12 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar12,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search_graph.cc"
                 ,0xd6,&local_1f8);
      __cxa_throw(pvVar12,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  uVar8 = 0;
LAB_00281b86:
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_258,(ulong)uVar8,&local_238,&local_259);
  local_1b8._16_8_ =
       (D->adj).
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (D->adj).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_258.
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1b8._0_8_ =
       (D->adj).
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1b8._8_8_ =
       (D->adj).
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (D->adj).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_258.
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (D->adj).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_258.
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_258.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_1b8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_258);
  if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_258.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)D->N;
  ppeVar13 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppeVar17 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_258.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start < (pointer)((long)ppeVar17 - (long)ppeVar13 >> 3)) {
    do {
      pwVar18 = (ppeVar13[(long)local_258.
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start]->l).cs.costs._begin;
      pwVar4 = (ppeVar13[(long)local_258.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start]->l).cs.costs._end;
      lVar19 = (long)pwVar4 - (long)pwVar18;
      if (lVar19 != 0) {
        lVar19 = lVar19 >> 4;
        lVar19 = lVar19 + (ulong)(lVar19 == 0);
        lVar20 = 4;
        do {
          if (D->N < *(uint *)((long)&pwVar18->x + lVar20)) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b8 + 0x10),
                       "error: edge source points to too large of a node id: ",0x35);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," > ",3);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            pvVar12 = (vw_exception *)__cxa_allocate_exception(0x38);
            std::__cxx11::stringbuf::str();
            VW::vw_exception::vw_exception
                      (pvVar12,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search_graph.cc"
                       ,0xe0,&local_218);
            __cxa_throw(pvVar12,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
          }
          lVar20 = lVar20 + 0x10;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
        if (pwVar4 != pwVar18) {
          lVar19 = 4;
          uVar10 = 0;
          do {
            uVar16 = (ulong)*(uint *)((long)&pwVar18->x + lVar19);
            if (uVar16 != 0) {
              pvVar5 = (D->adj).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              iVar6._M_current =
                   *(pointer *)
                    ((long)&pvVar5[uVar16 - 1].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data + 8);
              if ((iVar6._M_current ==
                   pvVar5[uVar16 - 1].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start) ||
                 ((pointer)iVar6._M_current[-1] !=
                  local_258.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)) {
                if (iVar6._M_current ==
                    *(pointer *)
                     ((long)&pvVar5[uVar16 - 1].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data + 0x10)) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                             (pvVar5 + (uVar16 - 1)),iVar6,(unsigned_long *)&local_258);
                }
                else {
                  *iVar6._M_current =
                       (unsigned_long)
                       local_258.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  ppuVar1 = (pointer *)
                            ((long)&pvVar5[uVar16 - 1].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data + 8);
                  *ppuVar1 = *ppuVar1 + 1;
                }
              }
            }
            uVar10 = uVar10 + 1;
            ppeVar13 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                       super__Vector_impl_data._M_start;
            pwVar18 = (ppeVar13[(long)local_258.
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start]->l).cs.costs._begin
            ;
            lVar19 = lVar19 + 0x10;
          } while (uVar10 < (ulong)((long)(ppeVar13[(long)local_258.
                                                                                                                    
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start]->l).cs.
                                          costs._end - (long)pwVar18 >> 4));
          ppeVar17 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
        }
      }
      local_258.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&((local_258.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1);
    } while (local_258.
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start <
             (pointer)((long)ppeVar17 - (long)ppeVar13 >> 3));
  }
  run_bfs(D,ec);
  puVar7 = (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar7) {
    (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7;
  }
  if (D->N != 0) {
    uVar10 = 0;
    do {
      local_1b8._0_8_ = D->K + 1;
      iVar6._M_current =
           (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&D->pred,iVar6,(unsigned_long *)local_1b8);
      }
      else {
        *iVar6._M_current = local_1b8._0_8_;
        ppuVar1 = &(D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < D->N);
  }
  return;
}

Assistant:

void setup(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();
  D.multiplier = D.wpp << D.ss;
  D.wpp = sch.get_vw_pointer_unsafe().wpp;
  D.mask = sch.get_vw_pointer_unsafe().weights.mask();
  D.ss = sch.get_vw_pointer_unsafe().weights.stride_shift();
  D.N = 0;
  D.E = 0;
  for (size_t i = 0; i < ec.size(); i++)
    if (example_is_edge(ec[i]))
      D.E++;
    else  // it's a node!
    {
      if (D.E > 0)
        THROW("error: got a node after getting edges!");

      D.N++;
      if (ec[i]->l.cs.costs.size() > 0)
      {
        D.true_counts[ec[i]->l.cs.costs[0].class_index] += 1.;
        D.true_counts_total += 1.;
      }
    }

  if ((D.N == 0) && (D.E > 0))
    THROW("error: got edges without any nodes (perhaps ring_size is too small?)!");

  D.adj = vector<vector<size_t>>(D.N, vector<size_t>(0));

  for (size_t i = D.N; i < ec.size(); i++)
  {
    for (size_t n = 0; n < ec[i]->l.cs.costs.size(); n++)
    {
      if (ec[i]->l.cs.costs[n].class_index > D.N)
        THROW("error: edge source points to too large of a node id: " << (ec[i]->l.cs.costs[n].class_index) << " > "
                                                                      << D.N);
    }
    for (size_t n = 0; n < ec[i]->l.cs.costs.size(); n++)
    {
      size_t nn = ec[i]->l.cs.costs[n].class_index;
      if ((nn > 0) &&
          (((D.adj[nn - 1].size() == 0) || (D.adj[nn - 1][D.adj[nn - 1].size() - 1] != i))))  // don't allow dups
        D.adj[nn - 1].push_back(i);
    }
  }

  run_bfs(D, ec);

  D.pred.clear();
  for (size_t n = 0; n < D.N; n++) D.pred.push_back(D.K + 1);
}